

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printValue(soul::Value_const&)::Printer::
printStringLiteral(choc::value::StringDictionary::Handle_(void *this,Handle h)

{
  char *in_RCX;
  string_view s;
  undefined1 auVar1 [16];
  string local_28;
  
  if (*(long **)((long)this + 8) == (long *)0x0) {
    std::__cxx11::to_string(&local_28,h.handle);
  }
  else {
    auVar1 = (**(code **)(**(long **)((long)this + 8) + 0x18))();
    s._M_len = auVar1._8_8_;
    s._M_str = in_RCX;
    choc::json::getEscapedQuotedString_abi_cxx11_(&local_28,auVar1._0_8_,s);
  }
  (**(code **)(*this + 0x98))(this,local_28._M_string_length,local_28._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void printStringLiteral (StringDictionary::Handle h) override
                {
                    print (dictionary != nullptr ? toHeartStringLiteral (dictionary->getStringForHandle (h))
                                                 : std::to_string (h.handle));
                }